

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

pool_ptr<soul::AST::Processor> __thiscall
soul::StructuralParser::parseTopLevelItem<soul::AST::Processor>
          (StructuralParser *this,CodeLocation *processorKeywordLocation,ModuleBase *parentModule)

{
  SourceCodeText *pSVar1;
  bool bVar2;
  QualifiedIdentifier *args_2;
  Processor *object;
  Namespace *pNVar3;
  ModuleBase *in_RCX;
  pool_ptr<soul::AST::Expression> specialisationArgs;
  pool_ptr<soul::AST::Namespace> newNamespace;
  pool_ptr<soul::AST::Namespace> parentNamespace;
  Identifier name;
  Context context;
  CodeLocation local_c8;
  UTF8Reader local_b8;
  pool_ptr<soul::AST::Namespace> local_b0;
  UTF8Reader local_a8;
  Identifier local_a0;
  undefined1 local_98 [16];
  Context local_88;
  undefined1 local_70 [64];
  
  getContext(&local_88,(StructuralParser *)processorKeywordLocation);
  local_a0 = parseIdentifierWithMaxLength((StructuralParser *)processorKeywordLocation,0x80);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)processorKeywordLocation,(TokenType)0x2a3521);
  if (bVar2) {
    args_2 = parseQualifiedIdentifier((StructuralParser *)processorKeywordLocation);
    parseSpecialisationArgs((StructuralParser *)&local_c8);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>
              ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                *)processorKeywordLocation,(TokenType)0x2a19e8);
    local_a8.data =
         (char *)allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::Expression>&>
                           ((StructuralParser *)processorKeywordLocation,&local_88,&local_a0,args_2,
                            (pool_ptr<soul::AST::Expression> *)&local_c8);
    std::
    vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>
              ((vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
                *)&in_RCX->namespaceAliases,
               (pool_ref<soul::AST::NamespaceAliasDeclaration> *)&local_a8);
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
    goto LAB_0022a7f1;
  }
  cast<soul::AST::Namespace,soul::AST::ModuleBase>((soul *)&local_a8,in_RCX);
  if ((NamespaceAliasDeclaration *)local_a8.data == (NamespaceAliasDeclaration *)0x0) {
    Errors::namespaceMustBeInsideNamespace<>();
    AST::Context::throwError(&local_88,(CompileMessage *)(local_70 + 8),false);
  }
  object = allocate<soul::AST::Processor,soul::CodeLocation&,soul::AST::Context&,soul::Identifier&>
                     ((StructuralParser *)processorKeywordLocation,(CodeLocation *)parentModule,
                      &local_88,&local_a0);
  pNVar3 = pool_ptr<soul::AST::Namespace>::operator->((pool_ptr<soul::AST::Namespace> *)&local_a8);
  local_c8.sourceCode.object = (SourceCodeText *)object;
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>
  ::emplace_back<soul::pool_ref<soul::AST::ModuleBase>>
            ((vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>
              *)&pNVar3->subModules,(pool_ref<soul::AST::ModuleBase> *)&local_c8);
  cast<soul::AST::Namespace,soul::AST::Processor>((soul *)&local_b0,object);
  pSVar1 = processorKeywordLocation[8].sourceCode.object;
  local_b8.data = processorKeywordLocation[8].location.data;
  processorKeywordLocation[8].location.data =
       (char *)&(object->super_ProcessorBase).super_ModuleBase.super_Scope;
  processorKeywordLocation[8].sourceCode.object = (SourceCodeText *)object;
  if (local_b0.object == (Namespace *)0x0) {
LAB_0022a7be:
    parseTopLevelDeclContent((StructuralParser *)processorKeywordLocation);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)processorKeywordLocation,(TokenType)0x2a2866);
    if (!bVar2) goto LAB_0022a7be;
    local_c8.sourceCode.object = (SourceCodeText *)0x0;
    local_c8.location.data = (char *)0x0;
    pNVar3 = pool_ptr<soul::AST::Namespace>::operator->(&local_b0);
    CodeLocation::operator=(&(pNVar3->super_ModuleBase).processorKeywordLocation,&local_c8);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_c8.sourceCode);
    local_98._0_8_ = (parentModule->super_ASTObject)._vptr_ASTObject;
    if ((SourceCodeText *)local_98._0_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_98._0_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_98._0_8_)->super_RefCountedObject).refCount + 1;
    }
    local_98._8_8_ = *(undefined8 *)&(parentModule->super_ASTObject).objectType;
    pool_ptr<soul::AST::Namespace>::operator*(&local_b0);
    parseTopLevelItem<soul::AST::Processor>
              ((StructuralParser *)local_70,processorKeywordLocation,(ModuleBase *)local_98);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)local_98);
  }
  processorKeywordLocation[8].sourceCode.object = pSVar1;
  local_c8.sourceCode.object = (SourceCodeText *)object;
  std::
  function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
  ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
               *)&(object->super_ProcessorBase).super_ModuleBase.createClone,
              (anon_class_8_1_e78d0acc *)&local_c8);
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)object;
  processorKeywordLocation[8].location.data = local_b8.data;
LAB_0022a7f1:
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_88);
  return (pool_ptr<soul::AST::Processor>)(Processor *)this;
}

Assistant:

pool_ptr<ModuleType> parseTopLevelItem (CodeLocation processorKeywordLocation, AST::ModuleBase& parentModule)
    {
        auto context = getContext();
        auto name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matchIf (Operator::assign))
        {
            auto& identifier = parseQualifiedIdentifier();
            auto specialisationArgs = parseSpecialisationArgs();
            expect (Operator::semicolon);
            auto& alias = allocate<AST::NamespaceAliasDeclaration> (context, name, identifier, specialisationArgs);
            parentModule.namespaceAliases.push_back (alias);
            return {};
        }

        auto parentNamespace = cast<AST::Namespace> (parentModule);

        if (parentNamespace == nullptr)
            context.throwError (Errors::namespaceMustBeInsideNamespace());

        auto& newModule = allocate<ModuleType> (processorKeywordLocation, context, name);
        parentNamespace->subModules.push_back (newModule);

        auto newNamespace = cast<AST::Namespace> (newModule);
        ScopedScope scope (*this, newModule);
        auto oldModule = module;
        module = newModule;

        if (newNamespace != nullptr && matchIf (Operator::doubleColon))
        {
            newNamespace->processorKeywordLocation = {};
            parseTopLevelItem<ModuleType> (processorKeywordLocation, *newNamespace);
        }
        else
        {
            parseTopLevelDeclContent();
        }

        module = oldModule;

        newModule.createClone = [&newModule] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
        {
            return cloneModuleWithNewName (a, parentNS, newModule, newName);
        };

        return newModule;
    }